

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O2

bool __thiscall
loader::context_t::driverSorting
          (context_t *this,driver_vector_t *drivers,ze_init_driver_type_desc_t *desc,bool sysmanOnly
          )

{
  pointer pdVar1;
  ze_driver_handle_t p_Var2;
  ze_device_handle_t p_Var3;
  __type_conflict1 _Var4;
  ze_result_t zVar5;
  ze_pfnDriverGet_t p_Var6;
  ze_pfnInitDrivers_t p_Var7;
  ze_result_t result;
  ze_result_t result_00;
  ze_result_t result_01;
  ze_result_t result_02;
  ze_result_t result_03;
  ze_result_t result_04;
  ze_result_t result_05;
  ze_result_t result_06;
  ze_result_t result_07;
  ze_result_t result_08;
  ze_result_t result_09;
  ze_init_driver_type_desc_t *desc_00;
  ze_init_driver_type_desc_t *desc_01;
  ze_init_driver_type_desc_t *desc_02;
  pointer pdVar8;
  string *psVar9;
  pointer pp_Var10;
  string *psVar11;
  pointer pp_Var12;
  pointer pdVar13;
  string *message_14;
  uint32_t pCount;
  uint local_670;
  uint local_66c;
  uint local_668;
  uint32_t deviceCount;
  string message_13;
  ze_driver_properties_t local_638;
  vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_> deviceHandles;
  vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> driverHandles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  driver_vector_t *local_5b0;
  ze_init_driver_type_desc_t local_5a8;
  ze_driver_properties_t *local_588;
  pointer local_580;
  ze_init_driver_type_desc_t *local_578;
  pointer local_570;
  pointer local_568;
  string message;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_5a8.pNext = (void *)0x0;
  local_5a8.stype = ZE_STRUCTURE_TYPE_INIT_DRIVER_TYPE_DESC;
  local_5a8._4_4_ = 0;
  local_5a8.flags = 0xffffffff;
  local_5a8._20_4_ = 0;
  pdVar13 = (drivers->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_568 = (drivers->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  local_5b0 = drivers;
  local_578 = desc;
  do {
    if (pdVar13 == local_568) {
      std::
      __sort<__gnu_cxx::__normal_iterator<loader::driver_t*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(loader::driver_t_const&,loader::driver_t_const&)>>
                ((local_5b0->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (local_5b0->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_loader::driver_t_&,_const_loader::driver_t_&)>)
                 driverSortComparator);
      if (this->debugTraceEnabled != false) {
        std::__cxx11::string::string
                  ((string *)&message,"Drivers after sorting:",(allocator *)&local_638);
        pdVar8 = (local_5b0->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pdVar13 = (local_5b0->
                       super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
                       _M_impl.super__Vector_impl_data._M_start; pdVar13 != pdVar8;
            pdVar13 = pdVar13 + 1) {
          std::__cxx11::to_string((string *)&deviceHandles,pdVar13->driverType);
          std::operator+(&local_5d0,"\nDriver Type: ",(string *)&deviceHandles);
          std::operator+(&message_13,&local_5d0," Driver Name: ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_638,&message_13,&pdVar13->name);
          std::__cxx11::string::append((string *)&message);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&message_13);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)&deviceHandles);
        }
        std::__cxx11::string::string((string *)&local_3d0,(string *)&message);
        std::__cxx11::string::string((string *)&local_3f0,"",(allocator *)&local_638);
        debug_trace_message(this,&local_3d0,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&message);
      }
      return true;
    }
    if (sysmanOnly) {
      pdVar1 = (this->zeDrivers).
               super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar8 = (this->zeDrivers).
                    super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                    super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
        _Var4 = std::operator==(&pdVar8->name,&pdVar13->name);
        if (_Var4) {
          if ((pdVar13->dditable).ze.Global.pfnInitDrivers == (ze_pfnInitDrivers_t)0x0) {
            (pdVar13->dditable).ze.Global.pfnInitDrivers =
                 (pdVar8->dditable).ze.Global.pfnInitDrivers;
          }
          if ((pdVar13->dditable).ze.Driver.pfnGet == (ze_pfnDriverGet_t)0x0) {
            (pdVar13->dditable).ze.Driver.pfnGet = (pdVar8->dditable).ze.Driver.pfnGet;
          }
          if ((pdVar13->dditable).ze.Driver.pfnGetProperties == (ze_pfnDriverGetProperties_t)0x0) {
            (pdVar13->dditable).ze.Driver.pfnGetProperties =
                 (pdVar8->dditable).ze.Driver.pfnGetProperties;
          }
          if ((pdVar13->dditable).ze.Device.pfnGet == (ze_pfnDeviceGet_t)0x0) {
            (pdVar13->dditable).ze.Device.pfnGet = (pdVar8->dditable).ze.Device.pfnGet;
          }
          if ((pdVar13->dditable).ze.Device.pfnGetProperties == (ze_pfnDeviceGetProperties_t)0x0) {
            (pdVar13->dditable).ze.Device.pfnGetProperties =
                 (pdVar8->dditable).ze.Device.pfnGetProperties;
          }
          break;
        }
      }
    }
    pCount = 0;
    driverHandles.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    driverHandles.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    driverHandles.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((local_578 == (ze_init_driver_type_desc_t *)0x0) ||
       (p_Var7 = (pdVar13->dditable).ze.Global.pfnInitDrivers, p_Var7 == (ze_pfnInitDrivers_t)0x0))
    {
      p_Var6 = (pdVar13->dditable).ze.Driver.pfnGet;
      if (p_Var6 == (ze_pfnDriverGet_t)0x0) {
        if (this->debugTraceEnabled == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_638,"driverSorting ",&pdVar13->name);
          std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_638,
                         " zeDriverGet and zeInitDrivers not supported, skipping driver");
          std::__cxx11::string::~string((string *)&local_638);
          psVar9 = &local_230;
          std::__cxx11::string::string((string *)psVar9,(string *)&message);
          psVar11 = &local_250;
          to_string_abi_cxx11_(psVar11,(loader *)0x0,result_02);
          debug_trace_message(this,psVar9,psVar11);
          goto LAB_001c4cf3;
        }
      }
      else if ((pdVar13->initStatus == ZE_RESULT_SUCCESS) && (pdVar13->legacyInitAttempted != false)
              ) {
        if (this->debugTraceEnabled == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_638,"driverSorting ",&pdVar13->name);
          std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_638," using zeDriverGet");
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::string((string *)&local_310,(string *)&message);
          std::__cxx11::string::string((string *)&local_190,"",(allocator *)&local_638);
          debug_trace_message(this,&local_310,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&message);
          p_Var6 = (pdVar13->dditable).ze.Driver.pfnGet;
        }
        zVar5 = (*p_Var6)(&pCount,(ze_driver_handle_t *)0x0);
        if (zVar5 == ZE_RESULT_SUCCESS) {
          std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::resize
                    (&driverHandles,(ulong)pCount);
          zVar5 = (*(pdVar13->dditable).ze.Driver.pfnGet)
                            (&pCount,driverHandles.
                                     super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (zVar5 == ZE_RESULT_SUCCESS) goto LAB_001c4d29;
          if (this->debugTraceEnabled == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_638,"driverSorting ",&pdVar13->name);
            std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_638," zeDriverGet returning ");
            std::__cxx11::string::~string((string *)&local_638);
            psVar9 = &local_1f0;
            std::__cxx11::string::string((string *)psVar9,(string *)&message);
            psVar11 = &local_210;
            to_string_abi_cxx11_(psVar11,(loader *)(ulong)zVar5,result_05);
            debug_trace_message(this,psVar9,psVar11);
            goto LAB_001c4cf3;
          }
        }
        else if (this->debugTraceEnabled == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_638,"driverSorting ",&pdVar13->name);
          std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_638," zeDriverGet returning ");
          std::__cxx11::string::~string((string *)&local_638);
          psVar9 = &local_1b0;
          std::__cxx11::string::string((string *)psVar9,(string *)&message);
          psVar11 = &local_1d0;
          to_string_abi_cxx11_(psVar11,(loader *)(ulong)zVar5,result_00);
          debug_trace_message(this,psVar9,psVar11);
          goto LAB_001c4cf3;
        }
      }
      else if (this->debugTraceEnabled == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_638,"driverSorting ",&pdVar13->name);
        std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_638," failed, zeInit returned ");
        std::__cxx11::string::~string((string *)&local_638);
        psVar9 = &local_150;
        std::__cxx11::string::string((string *)psVar9,(string *)&message);
        psVar11 = &local_170;
        to_string_abi_cxx11_(psVar11,(loader *)(ulong)pdVar13->initStatus,result_01);
        debug_trace_message(this,psVar9,psVar11);
        goto LAB_001c4cf3;
      }
    }
    else if (pdVar13->initDriversStatus == ZE_RESULT_SUCCESS) {
      if (this->debugTraceEnabled != false) {
        std::operator+(&local_5d0,"driverSorting ",&pdVar13->name);
        std::operator+(&message_13,&local_5d0," using zeInitDrivers(");
        to_string_abi_cxx11_((string *)&deviceHandles,(loader *)&local_5a8,desc_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_638,&message_13,(string *)&deviceHandles);
        std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_638,")");
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&deviceHandles);
        std::__cxx11::string::~string((string *)&message_13);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::string((string *)&local_90,(string *)&message);
        std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_638);
        debug_trace_message(this,&local_90,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&message);
        p_Var7 = (pdVar13->dditable).ze.Global.pfnInitDrivers;
      }
      pCount = 0;
      zVar5 = (*p_Var7)(&pCount,(ze_driver_handle_t *)0x0,&local_5a8);
      if (zVar5 == ZE_RESULT_SUCCESS) {
        std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::resize
                  (&driverHandles,(ulong)pCount);
        zVar5 = (*(pdVar13->dditable).ze.Global.pfnInitDrivers)
                          (&pCount,driverHandles.
                                   super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,&local_5a8);
        if (zVar5 == ZE_RESULT_SUCCESS) {
LAB_001c4d29:
          local_580 = driverHandles.
                      super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          psVar9 = &pdVar13->name;
          local_588 = &pdVar13->properties;
          for (pp_Var10 = driverHandles.
                          super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pp_Var10 != local_580;
              pp_Var10 = pp_Var10 + 1) {
            p_Var2 = *pp_Var10;
            local_638.pNext = (void *)0x0;
            local_638.uuid.id[0] = '\0';
            local_638.uuid.id[1] = '\0';
            local_638.uuid.id[2] = '\0';
            local_638.uuid.id[3] = '\0';
            local_638.uuid.id[4] = '\0';
            local_638.uuid.id[5] = '\0';
            local_638.uuid.id[6] = '\0';
            local_638.uuid.id[7] = '\0';
            local_638.uuid.id[8] = '\0';
            local_638.uuid.id[9] = '\0';
            local_638.uuid.id[10] = '\0';
            local_638.uuid.id[0xb] = '\0';
            local_638.uuid.id[0xc] = '\0';
            local_638.uuid.id[0xd] = '\0';
            local_638.uuid.id[0xe] = '\0';
            local_638.uuid.id[0xf] = '\0';
            local_638.driverVersion = 0;
            local_638._36_4_ = 0;
            local_638.stype = ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES;
            local_638._4_4_ = 0;
            zVar5 = (*(pdVar13->dditable).ze.Driver.pfnGetProperties)(p_Var2,&local_638);
            if (zVar5 == ZE_RESULT_SUCCESS) {
              local_588->driverVersion = local_638.driverVersion;
              *(undefined4 *)&local_588->field_0x24 = local_638._36_4_;
              *(undefined8 *)(local_588->uuid).id = local_638.uuid.id._0_8_;
              *(undefined8 *)((local_588->uuid).id + 8) = local_638.uuid.id._8_8_;
              local_588->stype = local_638.stype;
              *(undefined4 *)&local_588->field_0x4 = local_638._4_4_;
              local_588->pNext = local_638.pNext;
              deviceCount = 0;
              zVar5 = (*(pdVar13->dditable).ze.Device.pfnGet)
                                (p_Var2,&deviceCount,(ze_device_handle_t *)0x0);
              if (zVar5 == ZE_RESULT_SUCCESS) {
                if ((ulong)deviceCount == 0) {
                  if (this->debugTraceEnabled == true) {
                    std::operator+(&message_13,"driverSorting ",psVar9);
                    std::operator+(&message,&message_13," failed, zeDeviceGet returned 0 devices");
                    std::__cxx11::string::~string((string *)&message_13);
                    std::__cxx11::string::string((string *)&local_370,(string *)&message);
                    psVar11 = &local_2b0;
                    std::__cxx11::string::string((string *)psVar11,"",(allocator *)&message_13);
                    message_14 = &local_370;
                    debug_trace_message(this,message_14,psVar11);
                    goto LAB_001c4ef8;
                  }
                }
                else {
                  std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::vector
                            (&deviceHandles,(ulong)deviceCount,(allocator_type *)&message);
                  zVar5 = (*(pdVar13->dditable).ze.Device.pfnGet)
                                    (p_Var2,&deviceCount,
                                     deviceHandles.
                                     super__Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  if (zVar5 == ZE_RESULT_SUCCESS) {
                    local_570 = deviceHandles.
                                super__Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    local_670 = 0;
                    local_66c = 0;
                    local_668 = 0;
                    for (pp_Var12 = deviceHandles.
                                    super__Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start; pp_Var12 != local_570
                        ; pp_Var12 = pp_Var12 + 1) {
                      p_Var3 = *pp_Var12;
                      memset((ze_device_properties_t *)&message,0,0x170);
                      message._M_dataplus._M_p._0_4_ = 3;
                      zVar5 = (*(pdVar13->dditable).ze.Device.pfnGetProperties)
                                        (p_Var3,(ze_device_properties_t *)&message);
                      if (zVar5 == ZE_RESULT_SUCCESS) {
                        if (message.field_2._M_allocated_capacity._0_4_ == 1) {
                          local_670 = local_670 & 0xff;
                          if ((message.field_2._M_local_buf[0xc] & 1U) == 0) {
                            local_670 = 1;
                          }
                          local_668 = CONCAT31((int3)(local_668 >> 8),
                                               (byte)local_668 | message.field_2._M_local_buf[0xc]);
                        }
                        else {
                          local_66c = 1;
                        }
                      }
                      else if (this->debugTraceEnabled == true) {
                        std::operator+(&local_5d0,"driverSorting ",psVar9);
                        std::operator+(&message_13,&local_5d0,
                                       " failed, zeDeviceGetProperties returned ");
                        std::__cxx11::string::~string((string *)&local_5d0);
                        std::__cxx11::string::string((string *)&local_3b0,(string *)&message_13);
                        to_string_abi_cxx11_(&local_2f0,(loader *)(ulong)zVar5,result_09);
                        debug_trace_message(this,&local_3b0,&local_2f0);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::__cxx11::string::~string((string *)&local_3b0);
                        std::__cxx11::string::~string((string *)&message_13);
                      }
                    }
                    if ((local_668 & 1) == 0) {
                      if ((local_670 & 1) == 0) {
                        if ((local_66c & 1) != 0) {
                          pdVar13->driverType = ZEL_DRIVER_TYPE_OTHER;
                        }
                      }
                      else {
                        pdVar13->driverType = ZEL_DRIVER_TYPE_DISCRETE_GPU;
                      }
                    }
                    else if ((local_670 & 1) == 0) {
                      pdVar13->driverType = ZEL_DRIVER_TYPE_INTEGRATED_GPU;
                    }
                    else if ((local_66c & 1) == 0) {
                      pdVar13->driverType = ZEL_DRIVER_TYPE_GPU;
                    }
                    else {
                      pdVar13->driverType = ZEL_DRIVER_TYPE_MIXED;
                    }
                  }
                  else if (this->debugTraceEnabled == true) {
                    std::operator+(&message_13,"driverSorting ",psVar9);
                    std::operator+(&message,&message_13," failed, zeDeviceGet returned ");
                    std::__cxx11::string::~string((string *)&message_13);
                    std::__cxx11::string::string((string *)&local_390,(string *)&message);
                    to_string_abi_cxx11_(&local_2d0,(loader *)(ulong)zVar5,result_08);
                    debug_trace_message(this,&local_390,&local_2d0);
                    std::__cxx11::string::~string((string *)&local_2d0);
                    std::__cxx11::string::~string((string *)&local_390);
                    std::__cxx11::string::~string((string *)&message);
                  }
                  std::_Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::
                  ~_Vector_base(&deviceHandles.
                                 super__Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                               );
                }
              }
              else if (this->debugTraceEnabled == true) {
                std::operator+(&message_13,"driverSorting ",psVar9);
                std::operator+(&message,&message_13," failed, zeDeviceGet returned ");
                std::__cxx11::string::~string((string *)&message_13);
                std::__cxx11::string::string((string *)&local_350,(string *)&message);
                psVar11 = &local_290;
                to_string_abi_cxx11_(psVar11,(loader *)(ulong)zVar5,result_07);
                message_14 = &local_350;
                debug_trace_message(this,message_14,psVar11);
                goto LAB_001c4ef8;
              }
            }
            else if (this->debugTraceEnabled == true) {
              std::operator+(&message_13,"driverSorting ",psVar9);
              std::operator+(&message,&message_13," failed, zeDriverGetProperties returned ");
              std::__cxx11::string::~string((string *)&message_13);
              std::__cxx11::string::string((string *)&local_330,(string *)&message);
              psVar11 = &local_270;
              to_string_abi_cxx11_(psVar11,(loader *)(ulong)zVar5,result_06);
              message_14 = &local_330;
              debug_trace_message(this,message_14,psVar11);
LAB_001c4ef8:
              std::__cxx11::string::~string((string *)psVar11);
              std::__cxx11::string::~string((string *)message_14);
              std::__cxx11::string::~string((string *)&message);
            }
          }
        }
        else if (this->debugTraceEnabled == true) {
          std::operator+(&local_5d0,"driverSorting ",&pdVar13->name);
          std::operator+(&message_13,&local_5d0," zeInitDrivers(");
          to_string_abi_cxx11_((string *)&deviceHandles,(loader *)&local_5a8,desc_02);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_638,&message_13,(string *)&deviceHandles);
          std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_638,") returning ");
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&deviceHandles);
          std::__cxx11::string::~string((string *)&message_13);
          std::__cxx11::string::~string((string *)&local_5d0);
          psVar9 = &local_110;
          std::__cxx11::string::string((string *)psVar9,(string *)&message);
          psVar11 = &local_130;
          to_string_abi_cxx11_(psVar11,(loader *)(ulong)zVar5,result_04);
          debug_trace_message(this,psVar9,psVar11);
          goto LAB_001c4cf3;
        }
      }
      else if (this->debugTraceEnabled == true) {
        std::operator+(&local_5d0,"driverSorting ",&pdVar13->name);
        std::operator+(&message_13,&local_5d0," zeInitDrivers(");
        to_string_abi_cxx11_((string *)&deviceHandles,(loader *)&local_5a8,desc_01);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_638,&message_13,(string *)&deviceHandles);
        std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_638,") returning ");
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&deviceHandles);
        std::__cxx11::string::~string((string *)&message_13);
        std::__cxx11::string::~string((string *)&local_5d0);
        psVar9 = &local_d0;
        std::__cxx11::string::string((string *)psVar9,(string *)&message);
        psVar11 = &local_f0;
        to_string_abi_cxx11_(psVar11,(loader *)(ulong)zVar5,result_03);
        debug_trace_message(this,psVar9,psVar11);
        goto LAB_001c4cf3;
      }
    }
    else if (this->debugTraceEnabled != false) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_638
                     ,"driverSorting ",&pdVar13->name);
      std::operator+(&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_638," failed, zeInitDrivers returned ");
      std::__cxx11::string::~string((string *)&local_638);
      psVar9 = &local_50;
      std::__cxx11::string::string((string *)psVar9,(string *)&message);
      psVar11 = &local_70;
      to_string_abi_cxx11_(psVar11,(loader *)(ulong)pdVar13->initDriversStatus,result);
      debug_trace_message(this,psVar9,psVar11);
LAB_001c4cf3:
      std::__cxx11::string::~string((string *)psVar11);
      std::__cxx11::string::~string((string *)psVar9);
      std::__cxx11::string::~string((string *)&message);
    }
    std::_Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::~_Vector_base
              (&driverHandles.
                super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>);
    pdVar13 = pdVar13 + 1;
  } while( true );
}

Assistant:

bool context_t::driverSorting(driver_vector_t *drivers, ze_init_driver_type_desc_t* desc, bool sysmanOnly) {
        ze_init_driver_type_desc_t permissiveDesc = {};
        permissiveDesc.stype = ZE_STRUCTURE_TYPE_INIT_DRIVER_TYPE_DESC;
        permissiveDesc.pNext = nullptr;
        permissiveDesc.flags = UINT32_MAX;
        for (auto &driver : *drivers) {
            if (sysmanOnly) {
                for (auto &coreDriver : this->zeDrivers) {
                    if (coreDriver.name == driver.name) {
                        if (!driver.dditable.ze.Global.pfnInitDrivers) {
                            driver.dditable.ze.Global.pfnInitDrivers = coreDriver.dditable.ze.Global.pfnInitDrivers;
                        }
                        if (!driver.dditable.ze.Driver.pfnGet) {
                            driver.dditable.ze.Driver.pfnGet = coreDriver.dditable.ze.Driver.pfnGet;
                        }
                        if (!driver.dditable.ze.Driver.pfnGetProperties) {
                            driver.dditable.ze.Driver.pfnGetProperties = coreDriver.dditable.ze.Driver.pfnGetProperties;
                        }
                        if (!driver.dditable.ze.Device.pfnGet) {
                            driver.dditable.ze.Device.pfnGet = coreDriver.dditable.ze.Device.pfnGet;
                        }
                        if (!driver.dditable.ze.Device.pfnGetProperties) {
                            driver.dditable.ze.Device.pfnGetProperties = coreDriver.dditable.ze.Device.pfnGetProperties;
                        }
                        break;
                    }
                }
            }
            uint32_t pCount = 0;
            std::vector<ze_driver_handle_t> driverHandles;
            ze_result_t res = ZE_RESULT_SUCCESS;
            if (desc && driver.dditable.ze.Global.pfnInitDrivers) {
                if (driver.initDriversStatus != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeInitDrivers returned ";
                        debug_trace_message(message, loader::to_string(driver.initDriversStatus));
                    }
                    continue;
                }
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " using zeInitDrivers(" + loader::to_string(&permissiveDesc) + ")";
                    debug_trace_message(message, "");
                }
                pCount = 0;
                res = driver.dditable.ze.Global.pfnInitDrivers(&pCount, nullptr, &permissiveDesc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeInitDrivers(" + loader::to_string(&permissiveDesc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driverHandles.resize(pCount);
                // Use the driver's init function to query the driver handles and read the properties.
                res = driver.dditable.ze.Global.pfnInitDrivers(&pCount, driverHandles.data(), &permissiveDesc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeInitDrivers(" + loader::to_string(&permissiveDesc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
            } else if (driver.dditable.ze.Driver.pfnGet) {
                if (driver.initStatus != ZE_RESULT_SUCCESS || !driver.legacyInitAttempted) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeInit returned ";
                        debug_trace_message(message, loader::to_string(driver.initStatus));
                    }
                    continue;
                }
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " using zeDriverGet";
                    debug_trace_message(message, "");
                }
                res = driver.dditable.ze.Driver.pfnGet(&pCount, nullptr);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeDriverGet returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driverHandles.resize(pCount);
                res = driver.dditable.ze.Driver.pfnGet(&pCount, driverHandles.data());
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeDriverGet returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
            } else {
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " zeDriverGet and zeInitDrivers not supported, skipping driver";
                    debug_trace_message(message, loader::to_string(res));
                }
                continue;
            }

            for (auto handle : driverHandles) {
                ze_driver_properties_t properties = {};
                properties.stype = ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES;
                properties.pNext = nullptr;
                ze_result_t res = driver.dditable.ze.Driver.pfnGetProperties(handle, &properties);
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDriverGetProperties returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driver.properties = properties;
                uint32_t deviceCount = 0;
                res = driver.dditable.ze.Device.pfnGet( handle, &deviceCount, nullptr );
                if( ZE_RESULT_SUCCESS != res ) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                if (deviceCount == 0) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned 0 devices";
                        debug_trace_message(message, "");
                    }
                    continue;
                }
                std::vector<ze_device_handle_t> deviceHandles(deviceCount);
                res = driver.dditable.ze.Device.pfnGet( handle, &deviceCount, deviceHandles.data() );
                if( ZE_RESULT_SUCCESS != res ) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                bool integratedGPU = false;
                bool discreteGPU = false;
                bool other = false;
                for( auto device : deviceHandles ) {
                    ze_device_properties_t deviceProperties = {};
                    deviceProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES;
                    deviceProperties.pNext = nullptr;
                    res = driver.dditable.ze.Device.pfnGetProperties(device, &deviceProperties);
                    if( ZE_RESULT_SUCCESS != res ) {
                        if (debugTraceEnabled) {
                            std::string message = "driverSorting " + driver.name + " failed, zeDeviceGetProperties returned ";
                            debug_trace_message(message, loader::to_string(res));
                        }
                        continue;
                    }
                    if (deviceProperties.type == ZE_DEVICE_TYPE_GPU) {
                        if (deviceProperties.flags & ZE_DEVICE_PROPERTY_FLAG_INTEGRATED) {
                            integratedGPU = true;
                        } else {
                            discreteGPU = true;
                        }
                    } else {
                        other = true;
                    }
                }
                if (integratedGPU && discreteGPU && other) {
                    driver.driverType = ZEL_DRIVER_TYPE_MIXED;
                } else if (integratedGPU && discreteGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_GPU;
                } else if (integratedGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_INTEGRATED_GPU;
                } else if (discreteGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_DISCRETE_GPU;
                } else if (other) {
                    driver.driverType = ZEL_DRIVER_TYPE_OTHER;
                }
            }
        }

        // Sort drivers in ascending order of driver type unless ZE_ENABLE_PCI_ID_DEVICE_ORDER, then in decending order with MIXED and OTHER at the end.
        std::sort(drivers->begin(), drivers->end(), driverSortComparator);

        if (debugTraceEnabled) {
            std::string message = "Drivers after sorting:";
            for (const auto& driver : *drivers) {
                message += "\nDriver Type: " + std::to_string(driver.driverType) + " Driver Name: " + driver.name;
            }
            debug_trace_message(message, "");
        }
        return true;
    }